

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O2

void __thiscall
vkt::Draw::anon_unknown_0::DrawTestInstanceBase::generateRefImage
          (DrawTestInstanceBase *this,PixelBufferAccess *access,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *vertices,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *colors)

{
  ulong uVar1;
  PrimitiveType primitiveType;
  Renderer renderer;
  Program program;
  VertexAttrib local_348;
  undefined8 local_320;
  undefined8 uStack_318;
  pointer local_310;
  undefined8 local_308;
  undefined8 uStack_300;
  PassthruFragShader fragShader;
  MultisamplePixelBufferAccess colorBuffer;
  PassthruVertShader vertShader;
  DrawCommand local_260;
  PrimitiveList local_230;
  RenderState renderState;
  RenderTarget renderTarget;
  
  rr::VertexShader::VertexShader(&vertShader.super_VertexShader,2,1);
  vertShader.super_VertexShader._vptr_VertexShader = (_func_int **)&PTR_shadeVertices_00bd80e0;
  *(undefined8 *)
   vertShader.super_VertexShader.m_inputs.
   super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  (vertShader.super_VertexShader.m_outputs.
   super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  rr::FragmentShader::FragmentShader(&fragShader.super_FragmentShader,1,1);
  fragShader.super_FragmentShader._vptr_FragmentShader = (_func_int **)&PTR_shadeFragments_00bd8110;
  (fragShader.super_FragmentShader.m_inputs.
   super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  (fragShader.super_FragmentShader.m_outputs.
   super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  program.geometryShader = (GeometryShader *)0x0;
  program.vertexShader = &vertShader.super_VertexShader;
  program.fragmentShader = &fragShader.super_FragmentShader;
  rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(&colorBuffer,access);
  rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess
            ((MultisamplePixelBufferAccess *)&renderState);
  rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess
            ((MultisamplePixelBufferAccess *)&local_348);
  rr::RenderTarget::RenderTarget
            (&renderTarget,&colorBuffer,(MultisamplePixelBufferAccess *)&renderState,
             (MultisamplePixelBufferAccess *)&local_348);
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)&local_348,&colorBuffer);
  local_260.state = (RenderState *)0x0;
  local_260.renderTarget =
       (RenderTarget *)CONCAT44(local_348.pointer._0_4_,local_348.instanceDivisor);
  local_260.program = (Program *)0x3f80000000000000;
  rr::RenderState::RenderState
            (&renderState,(ViewportState *)&local_260,VIEWPORTORIENTATION_LOWER_LEFT);
  rr::Renderer::Renderer(&renderer);
  local_348.pointer =
       (vertices->super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_348.type = VERTEXATTRIBTYPE_FLOAT;
  local_348.size = 4;
  local_348.stride = 0x10;
  local_348.instanceDivisor = 0;
  local_348.generic.v._0_8_ = 0;
  local_348.generic.v._8_8_ = 0;
  local_310 = (colors->
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
  local_320 = 0x400000000;
  uStack_318 = 0x10;
  local_308 = 0;
  uStack_300 = 0;
  uVar1 = (ulong)(this->m_data).topology;
  if (uVar1 < 10) {
    primitiveType = *(PrimitiveType *)(&DAT_009ab534 + uVar1 * 4);
  }
  else {
    primitiveType = PRIMITIVETYPE_LAST;
  }
  rr::PrimitiveList::PrimitiveList
            (&local_230,primitiveType,
             (int)((ulong)((long)(vertices->
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_348.pointer) >> 4),0);
  local_260.program = &program;
  local_260.numVertexAttribs = 2;
  local_260.state = &renderState;
  local_260.renderTarget = &renderTarget;
  local_260.vertexAttribs = &local_348;
  local_260.primitives = &local_230;
  rr::Renderer::draw(&renderer,&local_260);
  rr::Renderer::~Renderer(&renderer);
  rr::FragmentShader::~FragmentShader(&fragShader.super_FragmentShader);
  rr::VertexShader::~VertexShader(&vertShader.super_VertexShader);
  return;
}

Assistant:

void DrawTestInstanceBase::generateRefImage (const tcu::PixelBufferAccess& access, const std::vector<tcu::Vec4>& vertices, const std::vector<tcu::Vec4>& colors) const
{
	const PassthruVertShader				vertShader;
	const PassthruFragShader				fragShader;
	const rr::Program						program			(&vertShader, &fragShader);
	const rr::MultisamplePixelBufferAccess	colorBuffer		= rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(access);
	const rr::RenderTarget					renderTarget	(colorBuffer);
	const rr::RenderState					renderState		((rr::ViewportState(colorBuffer)));
	const rr::Renderer						renderer;

	const rr::VertexAttrib	vertexAttribs[] =
	{
		rr::VertexAttrib(rr::VERTEXATTRIBTYPE_FLOAT, 4, sizeof(tcu::Vec4), 0, &vertices[0]),
		rr::VertexAttrib(rr::VERTEXATTRIBTYPE_FLOAT, 4, sizeof(tcu::Vec4), 0, &colors[0])
	};

	renderer.draw(rr::DrawCommand(renderState,
								  renderTarget,
								  program,
								  DE_LENGTH_OF_ARRAY(vertexAttribs),
								  &vertexAttribs[0],
								  rr::PrimitiveList(mapVkPrimitiveTopology(m_data.topology), (deUint32)vertices.size(), 0)));
}